

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

int Gia_VtaPerformInt(Gia_Man_t *pAig,Abs_Par_t *pPars)

{
  int *piVar1;
  byte bVar2;
  Vec_Set_t *pVVar3;
  uint *__dest;
  int **ppiVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  abctime aVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Vta_Man_t *p;
  abctime aVar12;
  sat_solver2 *psVar13;
  Abc_Frame_t *pAbc;
  Abc_Cex_t *pAVar14;
  Abs_Par_t *pAVar15;
  abctime aVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  Vec_Int_t *pVVar22;
  Gia_Man_t *pGVar23;
  char *pcVar24;
  Vta_Man_t *pVVar25;
  Vec_Vec_t *vFrames;
  Vec_Int_t **ppVVar26;
  ulong uVar27;
  double dVar28;
  double local_468;
  int Status;
  double local_458;
  int local_44c;
  double local_448;
  int local_440;
  int local_43c;
  Vec_Int_t **local_438;
  abctime local_430;
  int nConfls;
  Gia_Man_t *local_420;
  char Command [1000];
  
  pAVar15 = pPars;
  aVar9 = Abc_Clock();
  iVar5 = (int)pAVar15;
  if (pAig->vCos->nSize - pAig->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x5dc,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  if ((pPars->nFramesMax != 0) && (pPars->nFramesMax < pPars->nFramesStart)) {
    __assert_fail("pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x5dd,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  pGVar10 = Gia_ManPo(pAig,iVar5);
  if ((~*(ulong *)(pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff)) &
      0x1fffffff1fffffff) == 0) {
    pGVar10 = Gia_ManPo(pAig,iVar5);
    if ((pGVar10->field_0x3 & 0x20) == 0) {
      puts("Sequential miter is trivially UNSAT.");
      return 1;
    }
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pAig->pCexSeq);
      pAig->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pAVar14 = Abc_CexMakeTriv(pAig->nRegs,pAig->vCis->nSize - pAig->nRegs,1,0);
    pAig->pCexSeq = pAVar14;
    puts("Sequential miter is trivially SAT.");
    return 0;
  }
  if (pAig->vObjClasses == (Vec_Int_t *)0x0) {
    pVVar11 = Vec_IntAlloc(5);
    pAig->vObjClasses = pVVar11;
    Vec_IntPush(pVVar11,1);
    Vec_IntPush(pAig->vObjClasses,3);
    iVar5 = 4;
    Vec_IntPush(pAig->vObjClasses,4);
    pVVar11 = pAig->vObjClasses;
    pGVar10 = Gia_ManPo(pAig,iVar5);
    iVar5 = Gia_ObjFaninId0p(pAig,pGVar10);
    Vec_IntPush(pVVar11,iVar5);
  }
  pGVar23 = pAig;
  p = Vga_ManStart(pAig,pPars);
  pAVar15 = p->pPars;
  iVar5 = pAVar15->nTimeOut;
  if ((long)iVar5 != 0) {
    psVar13 = p->pSat;
    aVar12 = Abc_Clock();
    psVar13->nRuntimeLimit = aVar12 + (long)iVar5 * 1000000;
    pAVar15 = p->pPars;
  }
  if (pAVar15->fVerbose != 0) {
    Abc_Print((int)pGVar23,
              "Running variable-timeframe abstraction (VTA) with the following parameters:\n");
    Abc_Print((int)pGVar23,
              "FramePast = %d  FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%\n",
              (ulong)(uint)pPars->nFramesPast,(ulong)(uint)pPars->nFramesMax,
              (ulong)(uint)pPars->nConfLimit,(ulong)(uint)pPars->nTimeOut,pPars->nRatioMin);
    Abc_Print((int)pGVar23,"LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n",
              (ulong)(uint)pPars->nLearnedStart,(ulong)(uint)pPars->nLearnedDelta,
              (ulong)(uint)pPars->nLearnedPerce);
    Abc_Print((int)pGVar23,
              " Frame   %%   Abs   %%   Confl  Cex   Vars   Clas   Lrns   Core     Time      Mem\n")
    ;
  }
  local_430 = aVar9;
  if (p->vFrames->nSize < 1) {
    __assert_fail("Vec_PtrSize(p->vFrames) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x604,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  local_438 = &pAig->vObjClasses;
  iVar5 = -1;
  local_44c = 0;
  local_440 = 0;
  uVar20 = 0;
  local_420 = pAig;
  do {
    iVar7 = (int)pGVar23;
    uVar27 = (ulong)uVar20;
    iVar6 = p->pPars->nFramesMax;
    if (iVar6 <= (int)uVar20 && iVar6 != 0) goto LAB_00502c53;
    psVar13 = p->pSat;
    local_458 = (double)CONCAT44(local_458._4_4_,(int)(psVar13->stats).conflicts);
    p->pPars->iFrame = uVar20;
    if (uVar20 == p->nWords << 5) {
      iVar6 = Vec_IntDoubleWidth(p->vSeens,p->nWords);
      p->nWords = iVar6;
      psVar13 = p->pSat;
    }
    if (psVar13->qhead != psVar13->qtail) {
      __assert_fail("s->qhead == s->qtail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                    ,0xfa,"void sat_solver2_bookmark(sat_solver2 *)");
    }
    local_448 = (double)CONCAT44(local_448._4_4_,p->nObjs);
    iVar6 = psVar13->size;
    psVar13->iVarPivot = iVar6;
    psVar13->iTrailPivot = psVar13->qhead;
    pVVar3 = psVar13->pPrf1;
    if (pVVar3 != (Vec_Set_t *)0x0) {
      psVar13->hProofPivot =
           (pVVar3->iPage << ((byte)pVVar3->nPageSize & 0x1f)) + (int)*pVVar3->pPages[pVVar3->iPage]
      ;
    }
    __dest = psVar13->activity2;
    *(undefined8 *)(psVar13->Mem).BookMarkE = *(undefined8 *)(psVar13->Mem).nEntries;
    iVar7 = (psVar13->Mem).iPage[0];
    bVar2 = (byte)(psVar13->Mem).nPageSize;
    ppiVar4 = (psVar13->Mem).pPages;
    (psVar13->Mem).BookMarkH[0] = iVar7 << (bVar2 & 0x1f) | *ppiVar4[iVar7];
    iVar7 = (psVar13->Mem).iPage[1];
    (psVar13->Mem).BookMarkH[1] = iVar7 << (bVar2 & 0x1f) | *ppiVar4[iVar7];
    if (__dest != (uint *)0x0) {
      psVar13->var_inc2 = psVar13->var_inc;
      memcpy(__dest,psVar13->activity,(long)iVar6 << 2);
    }
    p->vAddedNew->nSize = 0;
    Vga_ManAddClausesOne(p,0,uVar20);
    if ((int)uVar20 < p->vFrames->nSize) {
      pVVar11 = (Vec_Int_t *)Vec_PtrEntry(p->vFrames,uVar20);
      Vga_ManLoadSlice(p,pVVar11,0);
    }
    else {
      iVar6 = 1;
      iVar7 = iVar5;
      while( true ) {
        uVar21 = p->pPars->nFramesPast;
        if ((int)uVar20 <= (int)uVar21) {
          uVar21 = uVar20;
        }
        if ((int)uVar21 < iVar6) break;
        pVVar11 = (Vec_Int_t *)Vec_PtrEntry(p->vCores,iVar7);
        Vga_ManLoadSlice(p,pVVar11,iVar6);
        iVar6 = iVar6 + 1;
        iVar7 = iVar7 + -1;
      }
    }
    uVar21 = uVar20 + 1;
    iVar6 = 0;
    local_43c = iVar5;
    while( true ) {
      aVar9 = Abc_Clock();
      iVar5 = Vga_ManGetOutLit(p,uVar20);
      pVVar11 = Vta_ManUnsatCore(iVar5,p->pSat,pPars->nConfLimit,(int)pPars,&Status,&nConfls);
      if ((Status != 1) == (pVVar11 != (Vec_Int_t *)0x0)) {
        __assert_fail("(vCore != NULL) == (Status == 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x621,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
      }
      if ((Status == -1) ||
         ((p->pSat->nRuntimeLimit != 0 && (aVar12 = Abc_Clock(), p->pSat->nRuntimeLimit < aVar12))))
      {
        pVVar25 = p;
        Vga_ManRollBack(p,local_448._0_4_);
        iVar7 = (int)pVVar25;
        goto LAB_00502c53;
      }
      aVar12 = Abc_Clock();
      if (pVVar11 != (Vec_Int_t *)0x0) break;
      p->timeSat = p->timeSat + (aVar12 - aVar9);
      if (Status != 0) {
        __assert_fail("Status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x633,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
      }
      p->nCexes = p->nCexes + 1;
      aVar9 = Abc_Clock();
      pAVar14 = Vta_ManRefineAbstraction(p,uVar20);
      aVar12 = Abc_Clock();
      p->timeCex = p->timeCex + (aVar12 - aVar9);
      if (pAVar14 != (Abc_Cex_t *)0x0) {
        pAVar15 = p->pPars;
        goto LAB_00502d1a;
      }
      iVar5 = (int)(p->pSat->stats).conflicts - local_458._0_4_;
      aVar9 = Abc_Clock();
      Vta_ManAbsPrintFrame
                (p,(Vec_Int_t *)0x0,uVar21,iVar5,iVar6,aVar9 - local_430,p->pPars->fVerbose);
      iVar6 = iVar6 + 1;
    }
    p->timeUnsat = p->timeUnsat + (aVar12 - aVar9);
    if (Status != 1) {
      __assert_fail("Status == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x63e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
    }
    pVVar22 = pVVar11;
    Vta_ManUnsatCoreRemap(p,pVVar11);
    Vec_IntSort(pVVar11,(int)pVVar22);
    sat_solver2_rollback(p->pSat);
    Vga_ManRollBack(p,local_448._0_4_);
    Vga_ManLoadSlice(p,pVVar11,0);
    Vec_IntFree(pVVar11);
    aVar9 = Abc_Clock();
    iVar7 = Vga_ManGetOutLit(p,uVar20);
    pVVar11 = Vta_ManUnsatCore(iVar7,p->pSat,pPars->nConfLimit,(int)pPars,&Status,&nConfls);
    aVar12 = Abc_Clock();
    p->timeUnsat = p->timeUnsat + (aVar12 - aVar9);
    if ((Status != 1) == (pVVar11 != (Vec_Int_t *)0x0)) {
      __assert_fail("(vCore != NULL) == (Status == 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x64e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
    }
    if (Status == -1) goto LAB_00502c53;
    if (Status == 0) {
      Vta_ManSatVerify(p);
      if ((*local_438 != (Vec_Int_t *)0x0) || (p->pPars->nFramesStart <= (int)uVar20)) {
        __assert_fail("pAig->vObjClasses == NULL && f < p->pPars->nFramesStart",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x655,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
      }
      pVVar25 = p;
      pAVar14 = Vga_ManDeriveCex(p);
      iVar7 = (int)pVVar25;
      pAVar15 = p->pPars;
      if (pAVar14 == (Abc_Cex_t *)0x0) goto LAB_00502c5c;
LAB_00502d1a:
      if (pAVar15->fVerbose != 0) {
        putchar(10);
      }
      pGVar23 = p->pGia;
      if (pGVar23->pCexSeq != (Abc_Cex_t *)0x0) {
        free(pGVar23->pCexSeq);
        pGVar23 = p->pGia;
        pGVar23->pCexSeq = (Abc_Cex_t *)0x0;
      }
      pGVar23->pCexSeq = pAVar14;
      iVar5 = 0;
      iVar6 = Gia_ManVerifyCex(pGVar23,pAVar14,0);
      iVar7 = (int)pGVar23;
      if (iVar6 == 0) {
        Abc_Print(iVar7,"    Gia_VtaPerform(): CEX verification has failed!\n");
      }
      Abc_Print(iVar7,"Counter-example detected in frame %d.  ",uVar27);
      p->pPars->iFrame = pAVar14->iFrame + -1;
      ppVVar26 = local_438;
      Vec_IntFreeP(local_438);
      iVar7 = (int)ppVVar26;
      goto LAB_00502e5a;
    }
    pVVar22 = pVVar11;
    Vta_ManUnsatCoreRemap(p,pVVar11);
    Vec_IntSort(pVVar11,(int)pVVar22);
    Vec_PtrPush(p->vCores,pVVar11);
    iVar5 = (int)(p->pSat->stats).conflicts - local_458._0_4_;
    aVar9 = Abc_Clock();
    pVVar25 = p;
    iVar6 = Vta_ManAbsPrintFrame(p,pVVar11,uVar21,iVar5,iVar6,aVar9 - local_430,p->pPars->fVerbose);
    iVar5 = local_43c;
    iVar7 = (int)pVVar11;
    if (iVar6 == 0) {
      iVar6 = local_44c + 1;
      if (local_44c + 1 == 2) {
        piVar1 = &p->pPars->nFramesNoChange;
        *piVar1 = *piVar1 + 1;
        iVar6 = Abc_FrameIsBridgeMode();
        if (iVar6 == 0) {
          iVar6 = 2;
        }
        else {
          if (local_440 != 0) {
            Gia_VtaSendCancel(pVVar25,iVar7);
          }
          Gia_VtaSendAbsracted(p,iVar7);
          local_44c = 2;
          local_440 = 1;
          iVar6 = local_44c;
        }
      }
    }
    else {
      p->pPars->nFramesNoChange = 0;
      iVar6 = 1;
    }
    local_44c = iVar6;
    if ((uVar20 & 1) != 0 && p->pPars->fDumpVabs != 0) {
      Abc_FrameSetStatus(-1);
      Abc_FrameSetCex((Abc_Cex_t *)0x0);
      Abc_FrameSetNFrames(uVar21);
      pcVar24 = p->pPars->pFileVabs;
      if (pcVar24 == (char *)0x0) {
        pcVar24 = "vtabs.aig";
      }
      pcVar24 = Extra_FileNameGenericAppend(pcVar24,".status");
      sprintf(Command,"write_status %s",pcVar24);
      pAbc = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAbc,Command);
      Gia_VtaDumpAbsracted(p,pPars->fVerbose);
    }
    iVar6 = p->nSeenGla;
    pGVar23 = local_420;
    iVar8 = Gia_ManCandNum(local_420);
    iVar7 = (int)pGVar23;
    iVar5 = iVar5 + 1;
    uVar20 = uVar21;
  } while (iVar6 < (iVar8 * (100 - pPars->nRatioMin)) / 100);
  Status = -1;
LAB_00502c53:
  pAVar15 = p->pPars;
LAB_00502c5c:
  if ((pAVar15->fVerbose != 0) && (Status == -1)) {
    iVar7 = 10;
    putchar(10);
  }
  ppVVar26 = local_438;
  iVar5 = p->vCores->nSize;
  if (iVar5 == 0) {
    Abc_Print(iVar7,"Abstraction is not produced because first frame is not solved.  ");
    goto LAB_00502e57;
  }
  if (iVar5 < 1) {
    __assert_fail("Vec_PtrSize(p->vCores) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x68e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  Vec_IntFreeP(local_438);
  vFrames = (Vec_Vec_t *)p->vCores;
  pVVar11 = Gia_VtaFramesToAbs(vFrames);
  iVar7 = (int)vFrames;
  *ppVVar26 = pVVar11;
  pAVar15 = p->pPars;
  if (Status == -1) {
    if ((pAVar15->nTimeOut == 0) || (aVar9 = Abc_Clock(), aVar9 < p->pSat->nRuntimeLimit)) {
      uVar20 = pPars->nConfLimit;
      if ((uVar20 == 0) || ((int)(p->pSat->stats).conflicts < (int)uVar20)) {
        iVar5 = p->nSeenGla;
        pGVar23 = local_420;
        iVar6 = Gia_ManCandNum(local_420);
        iVar7 = (int)pGVar23;
        if (iVar5 < (iVar6 * (100 - pPars->nRatioMin)) / 100) {
          Abc_Print(iVar7,"Abstraction stopped for unknown reason in frame %d.  ",uVar27);
          goto LAB_00502e57;
        }
        pcVar24 = "The ratio of abstracted objects is less than %d %% in frame %d.  ";
        uVar18 = (ulong)(uint)pPars->nRatioMin;
        uVar17 = uVar27;
        goto LAB_00502cc0;
      }
      uVar21 = p->pPars->nFramesNoChange;
      pcVar24 = "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ";
    }
    else {
      uVar20 = p->pPars->nTimeOut;
      uVar21 = p->pPars->nFramesNoChange;
      pcVar24 = "Timeout %d sec in frame %d with a %d-stable abstraction.    ";
    }
    Abc_Print(iVar7,pcVar24,(ulong)uVar20,uVar27,(ulong)uVar21);
  }
  else {
    pAVar15->iFrame = pAVar15->iFrame + 1;
    pcVar24 = "VTA completed %d frames with a %d-stable abstraction.  ";
    uVar17 = (ulong)(uint)pAVar15->nFramesNoChange;
    uVar18 = uVar27;
LAB_00502cc0:
    Abc_Print(iVar7,pcVar24,uVar18,uVar17);
  }
LAB_00502e57:
  iVar5 = -1;
LAB_00502e5a:
  aVar12 = Abc_Clock();
  aVar9 = local_430;
  lVar19 = aVar12 - local_430;
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)lVar19 / 1000000.0);
  if (p->pPars->fVerbose != 0) {
    aVar12 = Abc_Clock();
    p->timeOther = aVar12 - (p->timeUnsat + aVar9 + p->timeSat + p->timeCex);
    Abc_Print(iVar7,"%s =","Runtime: Solver UNSAT");
    local_458 = (double)p->timeUnsat / 1000000.0;
    aVar12 = Abc_Clock();
    local_468 = 0.0;
    dVar28 = 0.0;
    if (aVar12 != aVar9) {
      local_448 = (double)p->timeUnsat * 100.0;
      aVar12 = Abc_Clock();
      dVar28 = local_448 / (double)(aVar12 - aVar9);
    }
    Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",local_458,dVar28);
    Abc_Print(iVar7,"%s =","Runtime: Solver SAT  ");
    local_458 = (double)p->timeSat / 1000000.0;
    aVar12 = Abc_Clock();
    if (aVar12 != aVar9) {
      lVar19 = p->timeSat;
      aVar12 = Abc_Clock();
      local_468 = ((double)lVar19 * 100.0) / (double)(aVar12 - aVar9);
    }
    Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",local_458,local_468);
    Abc_Print(iVar7,"%s =","Runtime: Refinement  ");
    local_458 = (double)p->timeCex / 1000000.0;
    aVar12 = Abc_Clock();
    local_468 = 0.0;
    dVar28 = 0.0;
    if (aVar12 != aVar9) {
      local_448 = (double)p->timeCex * 100.0;
      aVar12 = Abc_Clock();
      dVar28 = local_448 / (double)(aVar12 - aVar9);
    }
    Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",local_458,dVar28);
    Abc_Print(iVar7,"%s =","Runtime: Other       ");
    local_458 = (double)p->timeOther / 1000000.0;
    aVar12 = Abc_Clock();
    if (aVar12 != aVar9) {
      lVar19 = p->timeOther;
      aVar12 = Abc_Clock();
      local_468 = ((double)lVar19 * 100.0) / (double)(aVar12 - aVar9);
    }
    Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",local_458,local_468);
    Abc_Print(iVar7,"%s =","Runtime: TOTAL       ");
    aVar12 = Abc_Clock();
    aVar16 = Abc_Clock();
    dVar28 = 0.0;
    if (aVar16 != aVar9) {
      aVar16 = Abc_Clock();
      local_458 = (double)(aVar16 - aVar9) * 100.0;
      aVar16 = Abc_Clock();
      dVar28 = local_458 / (double)(aVar16 - aVar9);
    }
    Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)(aVar12 - aVar9) / 1000000.0,dVar28);
    Gia_VtaPrintMemory(p);
  }
  Vga_ManStop(p);
  fflush(_stdout);
  return iVar5;
}

Assistant:

int Gia_VtaPerformInt( Gia_Man_t * pAig, Abs_Par_t * pPars )
{
    Vta_Man_t * p;
    Vec_Int_t * vCore;
    Abc_Cex_t * pCex = NULL;
    int i, f, nConfls, Status, nObjOld, RetValue = -1, nCountNoChange = 0, fOneIsSent = 0;
    abctime clk = Abc_Clock(), clk2;
    // preconditions
    assert( Gia_ManPoNum(pAig) == 1 );
    assert( pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            printf( "Sequential miter is trivially UNSAT.\n" );
            return 1;
        } 
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        printf( "Sequential miter is trivially SAT.\n" );
        return 0;
    }

    // compute intial abstraction
    if ( pAig->vObjClasses == NULL )
    {
        pAig->vObjClasses = Vec_IntAlloc( 5 );
        Vec_IntPush( pAig->vObjClasses, 1 );
        Vec_IntPush( pAig->vObjClasses, 3 );
        Vec_IntPush( pAig->vObjClasses, 4 );
        Vec_IntPush( pAig->vObjClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)) );
    }
    // start the manager
    p = Vga_ManStart( pAig, pPars );
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running variable-timeframe abstraction (VTA) with the following parameters:\n" );
        Abc_Print( 1, "FramePast = %d  FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%\n", 
            pPars->nFramesPast, pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin );
        Abc_Print( 1, "LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce );
//        Abc_Print( 1, "Frame   %%   Abs   %%   Confl  Cex    SatVar   Core   F0   F1   F2  ...\n" );
        Abc_Print( 1, " Frame   %%   Abs   %%   Confl  Cex   Vars   Clas   Lrns   Core     Time      Mem\n" );
    }
    assert( Vec_PtrSize(p->vFrames) > 0 );
    for ( f = i = 0; !p->pPars->nFramesMax || f < p->pPars->nFramesMax; f++ )
    {
        int nConflsBeg = sat_solver2_nconflicts(p->pSat);
        p->pPars->iFrame = f;
        // realloc storage for abstraction marks
        if ( f == p->nWords * 32 )
            p->nWords = Vec_IntDoubleWidth( p->vSeens, p->nWords );

        // create bookmark to be used for rollback
        nObjOld = p->nObjs;
        sat_solver2_bookmark( p->pSat );
        Vec_IntClear( p->vAddedNew );

        // load new timeframe
        Vga_ManAddClausesOne( p, 0, f );
        if ( f < Vec_PtrSize(p->vFrames) )
            Vga_ManLoadSlice( p, (Vec_Int_t *)Vec_PtrEntry(p->vFrames, f), 0 );
        else
        {
            for ( i = 1; i <= Abc_MinInt(p->pPars->nFramesPast, f); i++ )
                Vga_ManLoadSlice( p, (Vec_Int_t *)Vec_PtrEntry(p->vCores, f-i), i );
        }

        // iterate as long as there are counter-examples
        for ( i = 0; ; i++ )
        { 
            clk2 = Abc_Clock();
            vCore = Vta_ManUnsatCore( Vga_ManGetOutLit(p, f), p->pSat, pPars->nConfLimit, pPars->fVerbose, &Status, &nConfls );
            assert( (vCore != NULL) == (Status == 1) );
            if ( Status == -1 ) // resource limit is reached
            {
                Vga_ManRollBack( p, nObjOld );
                goto finish;
            }
            // check timeout
            if ( p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit )
            {
                Vga_ManRollBack( p, nObjOld );
                goto finish;
            }
            if ( vCore != NULL )
            {
                p->timeUnsat += Abc_Clock() - clk2;
                break;
            }
            p->timeSat += Abc_Clock() - clk2;
            assert( Status == 0 );
            p->nCexes++;
            // perform the refinement
            clk2 = Abc_Clock();
            pCex = Vta_ManRefineAbstraction( p, f );
            p->timeCex += Abc_Clock() - clk2;
            if ( pCex != NULL )
                goto finish;
            // print the result (do not count it towards change)
            Vta_ManAbsPrintFrame( p, NULL, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk, p->pPars->fVerbose );
        }
        assert( Status == 1 );
        // valid core is obtained
        Vta_ManUnsatCoreRemap( p, vCore );
        Vec_IntSort( vCore, 1 );
        // update the SAT solver
        sat_solver2_rollback( p->pSat );
        // update storage
        Vga_ManRollBack( p, nObjOld );
        // load this timeframe
        Vga_ManLoadSlice( p, vCore, 0 );
        Vec_IntFree( vCore );

        // run SAT solver
        clk2 = Abc_Clock();
        vCore = Vta_ManUnsatCore( Vga_ManGetOutLit(p, f), p->pSat, pPars->nConfLimit, p->pPars->fVerbose, &Status, &nConfls );
        p->timeUnsat += Abc_Clock() - clk2;
        assert( (vCore != NULL) == (Status == 1) );
        if ( Status == -1 ) // resource limit is reached
            break;
        if ( Status == 0 )
        {
            Vta_ManSatVerify( p );
            // make sure, there was no initial abstraction (otherwise, it was invalid)
            assert( pAig->vObjClasses == NULL && f < p->pPars->nFramesStart );
            pCex = Vga_ManDeriveCex( p );
            break;
        }
        // add the core
        Vta_ManUnsatCoreRemap( p, vCore );
        // add in direct topological order
        Vec_IntSort( vCore, 1 );
        Vec_PtrPush( p->vCores, vCore );
        // print the result
        if ( Vta_ManAbsPrintFrame( p, vCore, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk, p->pPars->fVerbose ) )
        {
            // reset the counter of frames without change
            nCountNoChange = 1;
            p->pPars->nFramesNoChange = 0;
        }
        else if ( ++nCountNoChange == 2 ) // time to send
        {
            p->pPars->nFramesNoChange++;
            if ( Abc_FrameIsBridgeMode() )
            {
                // cancel old one if it was sent
                if ( fOneIsSent )
                    Gia_VtaSendCancel( p, pPars->fVerbose );
                // send new one 
                Gia_VtaSendAbsracted( p, pPars->fVerbose );
                fOneIsSent = 1;
            }
        }
        // dump the model
        if ( p->pPars->fDumpVabs && (f & 1) )
        {
            char Command[1000];
            Abc_FrameSetStatus( -1 );
            Abc_FrameSetCex( NULL );
            Abc_FrameSetNFrames( f+1 );
            sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "vtabs.aig"), ".status") );
            Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
            Gia_VtaDumpAbsracted( p, pPars->fVerbose );
        }
        // check if the number of objects is below limit
        if ( p->nSeenGla >= Gia_ManCandNum(pAig) * (100-pPars->nRatioMin) / 100 )
        {
            Status = -1;
            break;
        }
    }
finish:
    // analize the results
    if ( pCex == NULL )
    {
        if ( p->pPars->fVerbose && Status == -1 )
            printf( "\n" );
        if ( Vec_PtrSize(p->vCores) == 0 )
            Abc_Print( 1, "Abstraction is not produced because first frame is not solved.  " );
        else
        {
            assert( Vec_PtrSize(p->vCores) > 0 );
//            if ( pAig->vObjClasses != NULL )
//                Abc_Print( 1, "Replacing the old abstraction by a new one.\n" );
            Vec_IntFreeP( &pAig->vObjClasses );
            pAig->vObjClasses = Gia_VtaFramesToAbs( (Vec_Vec_t *)p->vCores );
            if ( Status == -1 )
            {
                if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
                    Abc_Print( 1, "Timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, f, p->pPars->nFramesNoChange );
                else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
                    Abc_Print( 1, "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, f, p->pPars->nFramesNoChange );
                else if ( p->nSeenGla >= Gia_ManCandNum(pAig) * (100-pPars->nRatioMin) / 100 )
                    Abc_Print( 1, "The ratio of abstracted objects is less than %d %% in frame %d.  ", pPars->nRatioMin, f );
                else
                    Abc_Print( 1, "Abstraction stopped for unknown reason in frame %d.  ", f );
            }
            else
            {
                p->pPars->iFrame++;
                Abc_Print( 1, "VTA completed %d frames with a %d-stable abstraction.  ", f, p->pPars->nFramesNoChange );
            }
        }
    }
    else
    {
        if ( p->pPars->fVerbose )
            printf( "\n" );
        ABC_FREE( p->pGia->pCexSeq );
        p->pGia->pCexSeq = pCex;
        if ( !Gia_ManVerifyCex( p->pGia, pCex, 0 ) )
            Abc_Print( 1, "    Gia_VtaPerform(): CEX verification has failed!\n" );
        Abc_Print( 1, "Counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = pCex->iFrame - 1;
        Vec_IntFreeP( &pAig->vObjClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex;
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Gia_VtaPrintMemory( p );
    }

    Vga_ManStop( p );
    fflush( stdout );
    return RetValue;
}